

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<int>::reallocateTo(SmallVectorBase<int> *this,size_type newCapacity)

{
  pointer __dest;
  
  __dest = (pointer)detail::allocArray(newCapacity,4);
  if (this->len != 0) {
    memmove(__dest,this->data_,this->len << 2);
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->cap = newCapacity;
  this->data_ = __dest;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)detail::allocArray(newCapacity, sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }